

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O2

void __thiscall OpenMesh::PropertyContainer::clear(PropertyContainer *this)

{
  std::
  for_each<__gnu_cxx::__normal_iterator<OpenMesh::BaseProperty**,std::vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>>>,OpenMesh::PropertyContainer::ClearAll>
            ((this->properties_).
             super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->properties_).
             super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void clear()
  {
	// Clear properties vector:
	// Replaced the old version with new one
	// which performs a swap to clear values and
	// deallocate memory.

	// Old version (changed 22.07.09) {
	// std::for_each(properties_.begin(), properties_.end(), Delete());
    // }

	std::for_each(properties_.begin(), properties_.end(), ClearAll());
  }